

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O0

void __thiscall features::delete_v(features *this)

{
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  
  v_array<float>::delete_v((v_array<float> *)in_RDI);
  v_array<unsigned_long>::delete_v((v_array<unsigned_long> *)in_RDI);
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::delete_v(in_RDI);
  return;
}

Assistant:

void delete_v()
  {
    values.delete_v();
    indicies.delete_v();
    space_names.delete_v();
  }